

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_AES_PDF.cc
# Opt level: O0

void __thiscall
Pl_AES_PDF::Pl_AES_PDF
          (Pl_AES_PDF *this,char *identifier,Pipeline *next,bool encrypt,uchar *key,size_t key_bytes
          )

{
  logic_error *this_00;
  runtime_error *this_01;
  pointer __dest;
  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> local_50 [3];
  size_t local_38;
  size_t key_bytes_local;
  uchar *key_local;
  Pipeline *pPStack_20;
  bool encrypt_local;
  Pipeline *next_local;
  char *identifier_local;
  Pl_AES_PDF *this_local;
  
  local_38 = key_bytes;
  key_bytes_local = (size_t)key;
  key_local._7_1_ = encrypt;
  pPStack_20 = next;
  next_local = (Pipeline *)identifier;
  identifier_local = (char *)this;
  Pipeline::Pipeline(&this->super_Pipeline,identifier,next);
  (this->super_Pipeline)._vptr_Pipeline = (_func_int **)&PTR__Pl_AES_PDF_0058af90;
  QPDFCryptoProvider::getImpl();
  this->encrypt = (bool)(key_local._7_1_ & 1);
  this->cbc_mode = true;
  this->first = true;
  this->offset = 0;
  std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>::
  unique_ptr<std::default_delete<unsigned_char[]>,void>
            ((unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>> *)&this->key);
  this->key_bytes = local_38;
  this->use_zero_iv = false;
  this->use_specified_iv = false;
  this->disable_padding = false;
  if (pPStack_20 == (Pipeline *)0x0) {
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this_00,"Attempt to create Pl_AES_PDF with nullptr as next");
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  if ((local_38 != 0x20) && (local_38 != 0x10)) {
    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_01,"unsupported key length");
    __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::make_unique<unsigned_char[]>((size_t)local_50);
  std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::operator=
            (&this->key,local_50);
  std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr(local_50);
  __dest = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::get(&this->key);
  memcpy(__dest,(void *)key_bytes_local,local_38);
  memset(this->inbuf,0,0x10);
  memset(this->outbuf,0,0x10);
  memset(this->cbc_block,0,0x10);
  return;
}

Assistant:

Pl_AES_PDF::Pl_AES_PDF(
    char const* identifier,
    Pipeline* next,
    bool encrypt,
    unsigned char const* key,
    size_t key_bytes) :
    Pipeline(identifier, next),
    crypto(QPDFCryptoProvider::getImpl()),
    encrypt(encrypt),
    key_bytes(key_bytes)
{
    if (!next) {
        throw std::logic_error("Attempt to create Pl_AES_PDF with nullptr as next");
    }
    if (!(key_bytes == 32 || key_bytes == 16)) {
        throw std::runtime_error("unsupported key length");
    }
    this->key = std::make_unique<unsigned char[]>(key_bytes);
    std::memcpy(this->key.get(), key, key_bytes);
    std::memset(this->inbuf, 0, this->buf_size);
    std::memset(this->outbuf, 0, this->buf_size);
    std::memset(this->cbc_block, 0, this->buf_size);
}